

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00437e78 == '\x01') {
    DAT_00437e78 = '\0';
    (*(code *)*_Pipeline_default_instance_)();
  }
  if (DAT_00437ea0 == '\x01') {
    DAT_00437ea0 = '\0';
    (*(code *)*_PipelineClassifier_default_instance_)();
  }
  if (DAT_00437ec8 == '\x01') {
    DAT_00437ec8 = '\0';
    (*(code *)*_PipelineRegressor_default_instance_)();
  }
  if (DAT_00437f00 == '\x01') {
    DAT_00437f00 = '\0';
    (*(code *)*_FeatureDescription_default_instance_)();
  }
  if (DAT_00437f98 == '\x01') {
    DAT_00437f98 = '\0';
    (*(code *)*_Metadata_default_instance_)();
  }
  if (DAT_00438018 == '\x01') {
    DAT_00438018 = '\0';
    (*(code *)*__ModelDescription_default_instance_)();
  }
  if (DAT_00438048 == '\x01') {
    DAT_00438048 = '\0';
    (*(code *)*_SerializedModel_default_instance_)();
  }
  if (DAT_00438080 == '\x01') {
    DAT_00438080 = 0;
    (*(code *)*_Model_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}